

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  undefined1 *puVar1;
  char *pcVar2;
  CURLUcode CVar3;
  int iVar4;
  CURLU *u;
  long lVar5;
  long lVar6;
  size_t sVar7;
  curl_proxytype cVar8;
  CURLcode CVar9;
  proxy_info *ppVar10;
  char *scheme;
  char *host;
  char *proxypasswd;
  char *proxyuser;
  curl_proxytype local_48;
  curl_proxytype local_44;
  proxy_info *local_40;
  char *portptr;
  
  proxyuser = (char *)0x0;
  proxypasswd = (char *)0x0;
  u = curl_url();
  scheme = (char *)0x0;
  CVar3 = curl_url_set(u,CURLUPART_URL,proxy,0x208);
  if (CVar3 != CURLUE_OK) {
    Curl_failf(data,"Unsupported proxy syntax in \'%s\'",proxy);
    CVar9 = CURLE_COULDNT_RESOLVE_PROXY;
    goto LAB_00474124;
  }
  CVar3 = curl_url_get(u,CURLUPART_SCHEME,&scheme,0);
  CVar9 = CURLE_OUT_OF_MEMORY;
  if (CVar3 != CURLUE_OK) goto LAB_00474124;
  iVar4 = Curl_strcasecompare("https",scheme);
  if (iVar4 == 0) {
    iVar4 = Curl_strcasecompare("socks5h",scheme);
    if (iVar4 == 0) {
      iVar4 = Curl_strcasecompare("socks5",scheme);
      if (iVar4 == 0) {
        iVar4 = Curl_strcasecompare("socks4a",scheme);
        if (iVar4 == 0) {
          iVar4 = Curl_strcasecompare("socks4",scheme);
          cVar8 = CURLPROXY_SOCKS4;
          if (iVar4 == 0) {
            iVar4 = Curl_strcasecompare("socks",scheme);
            cVar8 = CURLPROXY_SOCKS4;
            if ((iVar4 == 0) &&
               (iVar4 = Curl_strcasecompare("http",scheme), cVar8 = proxytype, iVar4 == 0)) {
              Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
              CVar9 = CURLE_COULDNT_CONNECT;
              goto LAB_00474124;
            }
          }
        }
        else {
          cVar8 = CURLPROXY_SOCKS4A;
        }
      }
      else {
        cVar8 = CURLPROXY_SOCKS5;
      }
    }
    else {
      cVar8 = CURLPROXY_SOCKS5_HOSTNAME;
    }
  }
  else {
    cVar8 = CURLPROXY_HTTPS;
  }
  if ((cVar8 == CURLPROXY_HTTPS) && ((Curl_ssl->supports & 0x10) == 0)) {
    CVar9 = CURLE_NOT_BUILT_IN;
    Curl_failf(data,"Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
               proxy);
    goto LAB_00474124;
  }
  local_44 = cVar8 & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
  local_40 = &conn->socks_proxy;
  ppVar10 = &conn->http_proxy;
  if (local_44 == CURLPROXY_SOCKS4) {
    ppVar10 = local_40;
  }
  ppVar10->proxytype = cVar8;
  local_48 = cVar8;
  curl_url_get(u,CURLUPART_USER,&proxyuser,0x40);
  curl_url_get(u,CURLUPART_PASSWORD,&proxypasswd,0x40);
  if (proxypasswd != (char *)0x0 || proxyuser != (char *)0x0) {
    (*Curl_cfree)(ppVar10->user);
    ppVar10->user = proxyuser;
    (*Curl_cfree)(ppVar10->passwd);
    ppVar10->passwd = (char *)0x0;
    if ((proxypasswd == (char *)0x0) &&
       (proxypasswd = (*Curl_cstrdup)(""), proxypasswd == (char *)0x0)) goto LAB_00474124;
    ppVar10->passwd = proxypasswd;
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 | 1;
  }
  curl_url_get(u,CURLUPART_PORT,&portptr,0);
  if (portptr == (char *)0x0) {
    lVar5 = (data->set).proxyport;
    lVar6 = 0x438;
    if (local_48 == CURLPROXY_HTTPS) {
      lVar6 = 0x1bb;
    }
    if (lVar5 != 0) goto LAB_004740a1;
LAB_004740a9:
    ppVar10->port = lVar6;
    if (((local_44 == CURLPROXY_SOCKS4) || (conn->port < 0)) ||
       ((local_40->host).rawalloc == (char *)0x0)) {
      conn->port = lVar6;
    }
  }
  else {
    lVar5 = strtol(portptr,(char **)0x0,10);
    (*Curl_cfree)(portptr);
LAB_004740a1:
    lVar6 = lVar5;
    if (-1 < lVar6) goto LAB_004740a9;
  }
  CVar3 = curl_url_get(u,CURLUPART_HOST,&host,0x40);
  if (CVar3 == CURLUE_OK) {
    (*Curl_cfree)((ppVar10->host).rawalloc);
    pcVar2 = host;
    (ppVar10->host).rawalloc = host;
    if (*host == '[') {
      sVar7 = strlen(host);
      pcVar2[sVar7 - 1] = '\0';
      host = host + 1;
    }
    (ppVar10->host).name = host;
    CVar9 = CURLE_OK;
  }
LAB_00474124:
  (*Curl_cfree)(scheme);
  curl_url_cleanup(u);
  return CVar9;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *portptr;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  char *host;
  bool sockstype;
  CURLUcode uc;
  struct proxy_info *proxyinfo;
  CURLU *uhp = curl_url();
  CURLcode result = CURLE_OK;
  char *scheme = NULL;

  /* When parsing the proxy, allowing non-supported schemes since we have
     these made up ones for proxies. Guess scheme for URLs without it. */
  uc = curl_url_set(uhp, CURLUPART_URL, proxy,
                    CURLU_NON_SUPPORT_SCHEME|CURLU_GUESS_SCHEME);
  if(!uc) {
    /* parsed okay as a URL */
    uc = curl_url_get(uhp, CURLUPART_SCHEME, &scheme, 0);
    if(uc) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    if(strcasecompare("https", scheme))
      proxytype = CURLPROXY_HTTPS;
    else if(strcasecompare("socks5h", scheme))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(strcasecompare("socks5", scheme))
      proxytype = CURLPROXY_SOCKS5;
    else if(strcasecompare("socks4a", scheme))
      proxytype = CURLPROXY_SOCKS4A;
    else if(strcasecompare("socks4", scheme) ||
            strcasecompare("socks", scheme))
      proxytype = CURLPROXY_SOCKS4;
    else if(strcasecompare("http", scheme))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      result = CURLE_COULDNT_CONNECT;
      goto error;
    }
  }
  else {
    failf(data, "Unsupported proxy syntax in \'%s\'", proxy);
    result = CURLE_COULDNT_RESOLVE_PROXY;
    goto error;
  }

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      result = CURLE_NOT_BUILT_IN;
      goto error;
    }

  sockstype =
    proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
    proxytype == CURLPROXY_SOCKS5 ||
    proxytype == CURLPROXY_SOCKS4A ||
    proxytype == CURLPROXY_SOCKS4;

  proxyinfo = sockstype ? &conn->socks_proxy : &conn->http_proxy;
  proxyinfo->proxytype = proxytype;

  /* Is there a username and password given in this proxy url? */
  curl_url_get(uhp, CURLUPART_USER, &proxyuser, CURLU_URLDECODE);
  curl_url_get(uhp, CURLUPART_PASSWORD, &proxypasswd, CURLU_URLDECODE);
  if(proxyuser || proxypasswd) {
    Curl_safefree(proxyinfo->user);
    proxyinfo->user = proxyuser;
    Curl_safefree(proxyinfo->passwd);
    if(!proxypasswd) {
      proxypasswd = strdup("");
      if(!proxypasswd) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
    }
    proxyinfo->passwd = proxypasswd;
    conn->bits.proxy_user_passwd = TRUE; /* enable it */
  }

  curl_url_get(uhp, CURLUPART_PORT, &portptr, 0);

  if(portptr) {
    port = strtol(portptr, NULL, 10);
    free(portptr);
  }
  else {
    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }
  if(port >= 0) {
    proxyinfo->port = port;
    if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
      conn->port = port;
  }

  /* now, clone the proxy host name */
  uc = curl_url_get(uhp, CURLUPART_HOST, &host, CURLU_URLDECODE);
  if(uc) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }
  Curl_safefree(proxyinfo->host.rawalloc);
  proxyinfo->host.rawalloc = host;
  if(host[0] == '[') {
    /* this is a numerical IPv6, strip off the brackets */
    size_t len = strlen(host);
    host[len-1] = 0; /* clear the trailing bracket */
    host++;
  }
  proxyinfo->host.name = host;

  error:
  free(scheme);
  curl_url_cleanup(uhp);
  return result;
}